

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O0

BOOL PAL_IsDebuggerPresent(void)

{
  long lVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char *tracer_pid;
  ssize_t num_read;
  uint local_820;
  int status_fd;
  BOOL debugger_present;
  char buf [2048];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_820 = 0;
  __fd = open64("/proc/self/status",0);
  if (__fd == -1) {
    status_fd = 0;
  }
  else {
    sVar3 = read(__fd,&debugger_present,0x7ff);
    if (0 < sVar3) {
      *(undefined1 *)((long)&debugger_present + sVar3) = 0;
      pcVar4 = strstr((char *)&debugger_present,"TracerPid:");
      if (pcVar4 != (char *)0x0) {
        iVar2 = atoi(pcVar4 + 10);
        local_820 = (uint)(iVar2 != 0);
      }
    }
    close(__fd);
    status_fd = local_820;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return status_fd;
}

Assistant:

PALIMPORT
BOOL
PALAPI
PAL_IsDebuggerPresent()
{
#if defined(__LINUX__)
    BOOL debugger_present = FALSE;
    char buf[2048];

    int status_fd = open("/proc/self/status", O_RDONLY);
    if (status_fd == -1)
    {
        return FALSE;
    }
    ssize_t num_read = read(status_fd, buf, sizeof(buf) - 1);

    if (num_read > 0)
    {
        static const char TracerPid[] = "TracerPid:";
        char *tracer_pid;

        buf[num_read] = '\0';
        tracer_pid = strstr(buf, TracerPid);
        if (tracer_pid)
        {
            debugger_present = !!atoi(tracer_pid + sizeof(TracerPid) - 1);
        }
    }

    close(status_fd);

    return debugger_present;
#elif defined(__APPLE__)
    struct kinfo_proc info = {};
    size_t size = sizeof(info);
    int mib[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, getpid() };
    int ret = sysctl(mib, sizeof(mib)/sizeof(*mib), &info, &size, NULL, 0);

    if (ret == 0)
        return ((info.kp_proc.p_flag & P_TRACED) != 0);

    return FALSE;
#else
    return FALSE;
#endif
}